

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::ReferenceContext::deleteBuffer(ReferenceContext *this,DataBuffer *buffer)

{
  bool bVar1;
  DataBuffer *pDVar2;
  reference ppVVar3;
  size_type sVar4;
  reference pvVar5;
  ulong local_68;
  size_t vertexAttribNdx;
  __normal_iterator<sglr::rc::VertexArray_**,_std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>_>
  local_58;
  iterator i;
  undefined1 local_38 [8];
  vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> vertexArrays;
  int bindingNdx;
  DataBuffer *buffer_local;
  ReferenceContext *this_local;
  
  for (vertexArrays.
       super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      vertexArrays.
      super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 9;
      vertexArrays.
      super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           vertexArrays.
           super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pDVar2 = getBufferBinding(this,deleteBuffer::bindingPoints
                                   [vertexArrays.
                                    super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_]);
    if (pDVar2 == buffer) {
      setBufferBinding(this,deleteBuffer::bindingPoints
                            [vertexArrays.
                             super__Vector_base<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],
                       (DataBuffer *)0x0);
    }
  }
  std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>::vector
            ((vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> *)local_38);
  rc::ObjectManager<sglr::rc::VertexArray>::getAll
            (&this->m_vertexArrays,
             (vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> *)local_38);
  i._M_current = (VertexArray **)&this->m_clientVertexArray;
  std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>::push_back
            ((vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> *)local_38,
             (value_type *)&i);
  local_58._M_current =
       (VertexArray **)
       std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>::begin
                 ((vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> *)
                  local_38);
  while( true ) {
    vertexAttribNdx =
         (size_t)std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>::end
                           ((vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>
                             *)local_38);
    bVar1 = __gnu_cxx::operator!=
                      (&local_58,
                       (__normal_iterator<sglr::rc::VertexArray_**,_std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>_>
                        *)&vertexAttribNdx);
    if (!bVar1) break;
    ppVVar3 = __gnu_cxx::
              __normal_iterator<sglr::rc::VertexArray_**,_std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>_>
              ::operator*(&local_58);
    if ((*ppVVar3)->m_elementArrayBufferBinding == buffer) {
      rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference(&this->m_buffers,buffer);
      ppVVar3 = __gnu_cxx::
                __normal_iterator<sglr::rc::VertexArray_**,_std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>_>
                ::operator*(&local_58);
      (*ppVVar3)->m_elementArrayBufferBinding = (DataBuffer *)0x0;
    }
    local_68 = 0;
    while( true ) {
      ppVVar3 = __gnu_cxx::
                __normal_iterator<sglr::rc::VertexArray_**,_std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>_>
                ::operator*(&local_58);
      sVar4 = std::
              vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
              ::size(&(*ppVVar3)->m_arrays);
      if (sVar4 <= local_68) break;
      ppVVar3 = __gnu_cxx::
                __normal_iterator<sglr::rc::VertexArray_**,_std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>_>
                ::operator*(&local_58);
      pvVar5 = std::
               vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
               ::operator[](&(*ppVVar3)->m_arrays,local_68);
      if (pvVar5->bufferBinding == buffer) {
        rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference(&this->m_buffers,buffer);
        ppVVar3 = __gnu_cxx::
                  __normal_iterator<sglr::rc::VertexArray_**,_std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>_>
                  ::operator*(&local_58);
        pvVar5 = std::
                 vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                 ::operator[](&(*ppVVar3)->m_arrays,local_68);
        pvVar5->bufferDeleted = true;
        ppVVar3 = __gnu_cxx::
                  __normal_iterator<sglr::rc::VertexArray_**,_std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>_>
                  ::operator*(&local_58);
        pvVar5 = std::
                 vector<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                 ::operator[](&(*ppVVar3)->m_arrays,local_68);
        pvVar5->bufferBinding = (DataBuffer *)0x0;
      }
      local_68 = local_68 + 1;
    }
    __gnu_cxx::
    __normal_iterator<sglr::rc::VertexArray_**,_std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>_>
    ::operator++(&local_58,0);
  }
  std::vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_>::~vector
            ((vector<sglr::rc::VertexArray_*,_std::allocator<sglr::rc::VertexArray_*>_> *)local_38);
  rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference(&this->m_buffers,buffer);
  return;
}

Assistant:

void ReferenceContext::deleteBuffer (DataBuffer* buffer)
{
	static const deUint32 bindingPoints[] =
	{
		GL_ARRAY_BUFFER,
		GL_COPY_READ_BUFFER,
		GL_COPY_WRITE_BUFFER,
		GL_DRAW_INDIRECT_BUFFER,
		GL_ELEMENT_ARRAY_BUFFER,
		GL_PIXEL_PACK_BUFFER,
		GL_PIXEL_UNPACK_BUFFER,
		GL_TRANSFORM_FEEDBACK_BUFFER,
		GL_UNIFORM_BUFFER
	};

	for (int bindingNdx = 0; bindingNdx < DE_LENGTH_OF_ARRAY(bindingPoints); bindingNdx++)
	{
		if (getBufferBinding(bindingPoints[bindingNdx]) == buffer)
			setBufferBinding(bindingPoints[bindingNdx], DE_NULL);
	}

	{
		vector<VertexArray*> vertexArrays;
		m_vertexArrays.getAll(vertexArrays);
		vertexArrays.push_back(&m_clientVertexArray);

		for (vector<VertexArray*>::iterator i = vertexArrays.begin(); i != vertexArrays.end(); i++)
		{
			if ((*i)->m_elementArrayBufferBinding == buffer)
			{
				m_buffers.releaseReference(buffer);
				(*i)->m_elementArrayBufferBinding = DE_NULL;
			}

			for (size_t vertexAttribNdx = 0; vertexAttribNdx < (*i)->m_arrays.size(); ++vertexAttribNdx)
			{
				if ((*i)->m_arrays[vertexAttribNdx].bufferBinding == buffer)
				{
					m_buffers.releaseReference(buffer);
					(*i)->m_arrays[vertexAttribNdx].bufferDeleted = true;
					(*i)->m_arrays[vertexAttribNdx].bufferBinding = DE_NULL;
				}
			}
		}
	}

	DE_ASSERT(buffer->getRefCount() == 1);
	m_buffers.releaseReference(buffer);
}